

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall cmQtAutoGenerator::Logger::Logger(Logger *this)

{
  bool bVar1;
  uint uVar2;
  string verbose;
  unsigned_long iVerbose;
  string local_40;
  unsigned_long local_20;
  
  *(undefined8 *)((long)&(this->Mutex_).super___mutex_base._M_mutex.__data.__list.__prev + 5) = 0;
  *(undefined8 *)((long)&(this->Mutex_).super___mutex_base._M_mutex.__data.__list.__next + 5) = 0;
  *(undefined8 *)((long)&(this->Mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->Mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->Mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->Mutex_).super___mutex_base._M_mutex + 8) = 0;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bVar1 = cmsys::SystemTools::GetEnv("VERBOSE",&local_40);
  if (bVar1 && local_40._M_string_length != 0) {
    local_20 = 0;
    bVar1 = cmSystemTools::StringToULong(local_40._M_dataplus._M_p,&local_20);
    if (bVar1) {
      uVar2 = (uint)local_20;
    }
    else {
      bVar1 = cmSystemTools::IsOn(&local_40);
      uVar2 = (uint)bVar1;
    }
    this->Verbosity_ = uVar2;
  }
  std::__cxx11::string::~string((string *)&local_40);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  cmsys::SystemTools::GetEnv("COLOR",&local_40);
  if (local_40._M_string_length == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = cmSystemTools::IsOn(&local_40);
  }
  this->ColorOutput_ = bVar1;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

cmQtAutoGenerator::Logger::Logger()
{
  // Initialize logger
  {
    std::string verbose;
    if (cmSystemTools::GetEnv("VERBOSE", verbose) && !verbose.empty()) {
      unsigned long iVerbose = 0;
      if (cmSystemTools::StringToULong(verbose.c_str(), &iVerbose)) {
        SetVerbosity(static_cast<unsigned int>(iVerbose));
      } else {
        // Non numeric verbosity
        SetVerbose(cmSystemTools::IsOn(verbose));
      }
    }
  }
  {
    std::string colorEnv;
    cmSystemTools::GetEnv("COLOR", colorEnv);
    if (!colorEnv.empty()) {
      SetColorOutput(cmSystemTools::IsOn(colorEnv));
    } else {
      SetColorOutput(true);
    }
  }
}